

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

void __thiscall
VulkanHppGenerator::addMissingFlagBits
          (VulkanHppGenerator *this,
          vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
          *requireData,string *requiredBy)

{
  _Base_ptr *this_00;
  vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_> *this_01;
  pointer pRVar1;
  pointer pNVar2;
  pointer pNVar3;
  pointer pRVar4;
  bool bVar5;
  __type_conflict _Var6;
  iterator iVar7;
  size_type sVar8;
  iterator iVar9;
  NameLine *type;
  pointer __k;
  _Base_ptr this_02;
  pointer __lhs;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_232;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_231;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,TypeData>,std::_Select1st<std::pair<std::__cxx11::string_const,TypeData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,TypeData>>>
  *local_230;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>>>
  *local_228;
  pointer local_220;
  vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_> newTypes;
  string flagBits;
  undefined1 local_198 [32];
  _Base_ptr local_178;
  _Base_ptr local_170;
  _Alloc_hider local_168;
  ulong local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  bool local_148;
  pointer local_140;
  pointer pEStack_138;
  pointer local_130;
  pointer pEStack_128;
  pointer local_120;
  pointer pEStack_118;
  int local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>
  local_e0;
  
  local_220 = (requireData->
              super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
              )._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (requireData->
           super__Vector_base<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_228 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>>>
               *)&this->m_enums;
  local_230 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,TypeData>,std::_Select1st<std::pair<std::__cxx11::string_const,TypeData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,TypeData>>>
               *)&this->m_types;
  do {
    if (local_220 == pRVar1) {
      return;
    }
    newTypes.
    super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    newTypes.
    super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    newTypes.
    super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this_01 = &local_220->types;
    pNVar2 = (local_220->types).
             super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__k = (local_220->types).
               super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
               ._M_impl.super__Vector_impl_data._M_start; pRVar4 = local_220, __k != pNVar2;
        __k = __k + 1) {
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::BitmaskData>_>_>
              ::find(&(this->m_bitmasks)._M_t,&__k->name);
      if ((_Rb_tree_header *)iVar7._M_node != &(this->m_bitmasks)._M_t._M_impl.super__Rb_tree_header
         ) {
        this_00 = &iVar7._M_node[3]._M_left;
        if (iVar7._M_node[3]._M_right == (_Base_ptr)0x0) {
          this_02 = iVar7._M_node + 1;
          sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
                       "Flags",0);
          if (sVar8 == 0xffffffffffffffff) {
            __assert_fail("pos != std::string::npos",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x259,
                          "void VulkanHppGenerator::addMissingFlagBits(std::vector<RequireData> &, const std::string &)"
                         );
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,0,
                     sVar8 + 4);
          std::operator+(&local_e0.first,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_198,"Bit");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
                     sVar8 + 4,0xffffffffffffffff);
          std::operator+(&flagBits,&local_e0.first,&local_100);
          std::__cxx11::string::~string((string *)&local_100);
          std::__cxx11::string::~string((string *)&local_e0);
          std::__cxx11::string::~string((string *)local_198);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                     &flagBits);
          iVar9 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
                          *)local_228,&flagBits);
          if ((_Rb_tree_header *)iVar9._M_node ==
              &(this->m_enums)._M_t._M_impl.super__Rb_tree_header) {
            local_198._0_8_ = (pointer)0x0;
            local_198._8_8_ = 0;
            local_198._16_8_ = 0;
            local_198._24_8_ = local_198 + 8;
            local_170 = (_Base_ptr)0x0;
            local_168._M_p = (pointer)&local_158;
            local_160 = 0;
            local_158._M_local_buf[0] = '\0';
            local_148 = true;
            local_120 = (pointer)0x0;
            pEStack_118 = (pointer)0x0;
            local_130 = (pointer)0x0;
            pEStack_128 = (pointer)0x0;
            local_140 = (pointer)0x0;
            pEStack_138 = (pointer)0x0;
            local_110 = 0;
            local_178 = (_Base_ptr)local_198._24_8_;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_VulkanHppGenerator::EnumData,_true>
                      (&local_e0,&flagBits,(EnumData *)local_198);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>>>
            ::_M_insert_unique<std::pair<std::__cxx11::string_const,VulkanHppGenerator::EnumData>>
                      (local_228,&local_e0);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>
            ::~pair(&local_e0);
            EnumData::~EnumData((EnumData *)local_198);
            bVar5 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                    ::contains((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                                *)local_230,&flagBits);
            if (bVar5) {
              __assert_fail("!m_types.contains( flagBits )",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                            ,0x265,
                            "void VulkanHppGenerator::addMissingFlagBits(std::vector<RequireData> &, const std::string &)"
                           );
            }
            local_198._0_8_ = local_198._0_8_ & 0xffffffff00000000;
            std::__cxx11::string::string((string *)&local_100,requiredBy);
            __l._M_len = 1;
            __l._M_array = &local_100;
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_198 + 8),__l,&local_231,&local_232);
            local_160 = local_160 & 0xffffffff00000000;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TypeData,_true>
                      ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>
                        *)&local_e0,&flagBits,(TypeData *)local_198);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,TypeData>,std::_Select1st<std::pair<std::__cxx11::string_const,TypeData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,TypeData>>>
            ::_M_insert_unique<std::pair<std::__cxx11::string_const,TypeData>>
                      (local_230,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>
                        *)&local_e0);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>
            ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>
                     *)&local_e0);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(local_198 + 8));
            std::__cxx11::string::~string((string *)&local_100);
          }
          else {
            bVar5 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                    ::contains((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                                *)local_230,&flagBits);
            if (!bVar5) {
              __assert_fail("m_types.contains( flagBits )",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                            ,0x26a,
                            "void VulkanHppGenerator::addMissingFlagBits(std::vector<RequireData> &, const std::string &)"
                           );
            }
            *(undefined1 *)&iVar9._M_node[4]._M_left = 1;
          }
          std::__cxx11::string::~string((string *)&flagBits);
        }
        __lhs = (local_220->types).
                super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                ._M_impl.super__Vector_impl_data._M_start;
        pNVar3 = (local_220->types).
                 super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        do {
          if (__lhs == pNVar3) {
            std::__cxx11::string::string
                      ((string *)&local_e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00)
            ;
            local_e0.second.aliases._M_t._M_impl._0_4_ = *(undefined4 *)&iVar7._M_node[5]._M_left;
            std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
            ::emplace_back<VulkanHppGenerator::NameLine>(&newTypes,(NameLine *)&local_e0);
            std::__cxx11::string::~string((string *)&local_e0);
            break;
          }
          _Var6 = std::operator==(&__lhs->name,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)this_00);
          __lhs = __lhs + 1;
        } while (!_Var6);
      }
    }
    std::vector<VulkanHppGenerator::NameLine,std::allocator<VulkanHppGenerator::NameLine>>::
    insert<__gnu_cxx::__normal_iterator<VulkanHppGenerator::NameLine*,std::vector<VulkanHppGenerator::NameLine,std::allocator<VulkanHppGenerator::NameLine>>>,void>
              ((vector<VulkanHppGenerator::NameLine,std::allocator<VulkanHppGenerator::NameLine>> *)
               this_01,(local_220->types).
                       super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
                )newTypes.
                 super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
                )newTypes.
                 super__Vector_base<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>::
    ~vector(&newTypes);
    local_220 = pRVar4 + 1;
  } while( true );
}

Assistant:

void VulkanHppGenerator::addMissingFlagBits( std::vector<RequireData> & requireData, std::string const & requiredBy )
{
  for ( auto & require : requireData )
  {
    std::vector<NameLine> newTypes;
    for ( auto const & type : require.types )
    {
      auto bitmaskIt = m_bitmasks.find( type.name );
      if ( bitmaskIt != m_bitmasks.end() )
      {
        if ( bitmaskIt->second.require.empty() )
        {
          // generate the flagBits enum name out of the bitmask name: VkFooFlagsXXX -> VkFooFlagBitsXXX
          const size_t pos = bitmaskIt->first.find( "Flags" );
          assert( pos != std::string::npos );
          std::string flagBits = bitmaskIt->first.substr( 0, pos + 4 ) + "Bit" + bitmaskIt->first.substr( pos + 4 );

          bitmaskIt->second.require = flagBits;

          // some flagsBits are specified but never listed as required for any flags!
          // so, even if this bitmask has no enum listed as required, it might still already exist in the enums list
          auto enumIt = m_enums.find( flagBits );
          if ( enumIt == m_enums.end() )
          {
            m_enums.insert( { flagBits, EnumData{ .isBitmask = true, .xmlLine = 0 } } );

            assert( !m_types.contains( flagBits ) );
            m_types.insert( { flagBits, TypeData{ TypeCategory::Bitmask, { requiredBy }, 0 } } );
          }
          else
          {
            assert( m_types.contains( flagBits ) );
            enumIt->second.isBitmask = true;
          }
        }
        if ( std::ranges::none_of( require.types, [bitmaskIt]( auto const & requireType ) { return requireType.name == bitmaskIt->second.require; } ) )
        {
          // this bitmask requires a flags type that is not listed in here, so add it
          newTypes.push_back( { bitmaskIt->second.require, bitmaskIt->second.xmlLine } );
        }
      }
    }
    // add all the newly created flagBits types to the require list as if they had been part of the vk.xml!
    require.types.insert( require.types.end(), newTypes.begin(), newTypes.end() );
  }
}